

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::
dispatch_with_conversions<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
          (detail *this,
          __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
          begin,__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                *end,Function_Params *plist,Type_Conversions_State *t_conversions,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funcs)

{
  allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> *this_00;
  Proxy_Function_Base *params;
  bool bVar1;
  const_reference pvVar2;
  dispatch_error *pdVar3;
  const_iterator __first;
  const_iterator __last;
  size_t __n;
  pointer ppVar4;
  Boxed_Value *pBVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar6;
  bad_boxed_cast *anon_var_0;
  arity_error *anon_var_0_1;
  guard_error *anon_var_0_2;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_110;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_100;
  Type_Info *local_f8;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  local_f0;
  Type_Info *local_e8;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *local_e0;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *tis;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> newplist;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_a8;
  undefined1 local_8d;
  allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> local_79;
  __normal_iterator<const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  local_78;
  __normal_iterator<const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  local_70;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_68;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *local_50;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *next_fun_param_types;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *mat_fun_param_types;
  __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
  matching_func;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *t_funcs_local;
  Type_Conversions_State *t_conversions_local;
  Function_Params *plist_local;
  __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
  *end_local;
  __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
  begin_local;
  
  mat_fun_param_types =
       (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)end->_M_current;
  matching_func._M_current =
       (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)t_funcs;
  end_local = (__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
               *)begin._M_current;
  begin_local._M_current =
       (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)this;
  do {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                      ((__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                        *)&end_local,end);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = __gnu_cxx::
              operator==<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                        ((__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                          *)&mat_fun_param_types,end);
      if (bVar1) {
        newplist.
        super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        pdVar3 = (dispatch_error *)__cxa_allocate_exception(0x40);
        __first = std::
                  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                  ::begin((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                           *)matching_func._M_current);
        __last = std::
                 vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                 ::end((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                        *)matching_func._M_current);
        this_00 = (allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> *)
                  ((long)&newplist.
                          super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::allocator
                  (this_00);
        std::
        vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
        ::
        vector<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>,void>
                  ((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
                    *)&local_a8,
                   (__normal_iterator<const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                    )__first._M_current,
                   (__normal_iterator<const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                    )__last._M_current,this_00);
        exception::dispatch_error::dispatch_error(pdVar3,plist,&local_a8);
        newplist.
        super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(pdVar3,&exception::dispatch_error::typeinfo,
                    exception::dispatch_error::~dispatch_error);
      }
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)&tis);
      __n = Function_Params::size(plist);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::reserve
                ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)&tis,
                 __n);
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
               ::operator->((__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                             *)&mat_fun_param_types);
      local_e0 = Proxy_Function_Base::get_param_types(ppVar4->second);
      local_f0._M_current =
           (Type_Info *)
           std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::begin
                     (local_e0);
      local_e8 = (Type_Info *)
                 __gnu_cxx::
                 __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
                 ::operator+(&local_f0,1);
      local_f8 = (Type_Info *)
                 std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::end
                           (local_e0);
      pBVar5 = Function_Params::begin(plist);
      local_100 = (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                  std::
                  back_inserter<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
                            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                              *)&tis);
      local_110 = (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                  std::
                  transform<__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>,chaiscript::Boxed_Value_const*,std::back_insert_iterator<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,chaiscript::dispatch::detail::dispatch_with_conversions<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>(__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>const&,chaiscript::Function_Params_const&,chaiscript::Type_Conversions_State_const&,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>const&)::_lambda(chaiscript::Type_Info_const&,chaiscript::Boxed_Value_const&)_1_>
                            (local_e8,local_f8,pBVar5,local_100);
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
               ::operator->((__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                             *)&mat_fun_param_types);
      params = ppVar4->second;
      Function_Params::Function_Params
                ((Function_Params *)&anon_var_0_2,
                 (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)&tis);
      Proxy_Function_Base::operator()
                ((Proxy_Function_Base *)this,(Function_Params *)params,
                 (Type_Conversions_State *)&anon_var_0_2);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)&tis);
      BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (Boxed_Value)
             BVar6.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
    }
    ppVar4 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
             ::operator->((__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                           *)&end_local);
    bVar1 = types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>
                      (&ppVar4->second,plist,t_conversions);
    if (bVar1) {
      bVar1 = __gnu_cxx::
              operator==<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                        ((__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                          *)&mat_fun_param_types,end);
      if (bVar1) {
        mat_fun_param_types =
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)end_local;
      }
      else {
        ppVar4 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                 ::operator->((__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                               *)&mat_fun_param_types);
        next_fun_param_types = Proxy_Function_Base::get_param_types(ppVar4->second);
        ppVar4 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                 ::operator->((__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                               *)&end_local);
        local_50 = Proxy_Function_Base::get_param_types(ppVar4->second);
        pBVar5 = Function_Params::operator[](plist,0);
        bVar1 = Boxed_Value::is_const(pBVar5);
        if (bVar1) {
          pvVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                   operator[](next_fun_param_types,1);
          bVar1 = Type_Info::is_const(pvVar2);
          if (!bVar1) {
            pvVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                     operator[](local_50,1);
            bVar1 = Type_Info::is_const(pvVar2);
            if (bVar1) {
              mat_fun_param_types =
                   (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                   end_local;
              goto LAB_00633e45;
            }
          }
        }
        pBVar5 = Function_Params::operator[](plist,0);
        bVar1 = Boxed_Value::is_const(pBVar5);
        if (bVar1) {
LAB_00633d4b:
          local_8d = 1;
          pdVar3 = (dispatch_error *)__cxa_allocate_exception(0x40);
          local_70._M_current =
               (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)
               std::
               vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
               ::begin((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                        *)matching_func._M_current);
          local_78._M_current =
               (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)
               std::
               vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
               ::end((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                      *)matching_func._M_current);
          std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::
          allocator(&local_79);
          std::
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
          ::
          vector<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>,void>
                    ((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
                      *)&local_68,local_70,local_78,&local_79);
          exception::dispatch_error::dispatch_error(pdVar3,plist,&local_68);
          local_8d = 0;
          __cxa_throw(pdVar3,&exception::dispatch_error::typeinfo,
                      exception::dispatch_error::~dispatch_error);
        }
        pvVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                 operator[](next_fun_param_types,1);
        bVar1 = Type_Info::is_const(pvVar2);
        if (bVar1) goto LAB_00633d4b;
        pvVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                 operator[](local_50,1);
        bVar1 = Type_Info::is_const(pvVar2);
        if (!bVar1) goto LAB_00633d4b;
      }
    }
LAB_00633e45:
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                  *)&end_local);
  } while( true );
}

Assistant:

Boxed_Value dispatch_with_conversions(InItr begin,
                                            const InItr &end,
                                            const chaiscript::Function_Params &plist,
                                            const Type_Conversions_State &t_conversions,
                                            const Funcs &t_funcs) {
        InItr matching_func(end);

        while (begin != end) {
          if (types_match_except_for_arithmetic(begin->second, plist, t_conversions)) {
            if (matching_func == end) {
              matching_func = begin;
            } else {
              // handle const members vs non-const member, which is not really ambiguous
              const auto &mat_fun_param_types = matching_func->second->get_param_types();
              const auto &next_fun_param_types = begin->second->get_param_types();

              if (plist[0].is_const() && !mat_fun_param_types[1].is_const() && next_fun_param_types[1].is_const()) {
                matching_func = begin; // keep the new one, the const/non-const matchup is correct
              } else if (!plist[0].is_const() && !mat_fun_param_types[1].is_const() && next_fun_param_types[1].is_const()) {
                // keep the old one, it has a better const/non-const matchup
              } else {
                // ambiguous function call
                throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));
              }
            }
          }

          ++begin;
        }

        if (matching_func == end) {
          // no appropriate function to attempt arithmetic type conversion on
          throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));
        }

        std::vector<Boxed_Value> newplist;
        newplist.reserve(plist.size());

        const std::vector<Type_Info> &tis = matching_func->second->get_param_types();
        std::transform(tis.begin() + 1, tis.end(), plist.begin(), std::back_inserter(newplist), [](const Type_Info &ti, const Boxed_Value &param) -> Boxed_Value {
          if (ti.is_arithmetic() && param.get_type_info().is_arithmetic() && param.get_type_info() != ti) {
            return Boxed_Number(param).get_as(ti).bv;
          } else {
            return param;
          }
        });

        try {
          return (*(matching_func->second))(chaiscript::Function_Params{newplist}, t_conversions);
        } catch (const exception::bad_boxed_cast &) {
          // parameter failed to cast
        } catch (const exception::arity_error &) {
          // invalid num params
        } catch (const exception::guard_error &) {
          // guard failed to allow the function to execute
        }

        throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));
      }